

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O2

void jpeg_copy_critical_parameters(j_decompress_ptr srcinfo,j_compress_ptr dstinfo)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  JDIMENSION JVar3;
  J_COLOR_SPACE JVar4;
  int iVar5;
  UINT16 UVar6;
  int iVar7;
  JQUANT_TBL *pJVar8;
  long lVar9;
  jpeg_component_info *pjVar10;
  JQUANT_TBL *pJVar11;
  long lVar12;
  jpeg_component_info *pjVar13;
  byte bVar14;
  
  bVar14 = 0;
  iVar7 = dstinfo->global_state;
  if (iVar7 != 100) {
    pjVar2 = dstinfo->err;
    pjVar2->msg_code = 0x14;
    (pjVar2->msg_parm).i[0] = iVar7;
    (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
  }
  JVar3 = srcinfo->image_height;
  iVar7 = srcinfo->num_components;
  JVar4 = srcinfo->jpeg_color_space;
  dstinfo->image_width = srcinfo->image_width;
  dstinfo->image_height = JVar3;
  dstinfo->input_components = iVar7;
  dstinfo->in_color_space = JVar4;
  jpeg_set_defaults(dstinfo);
  jpeg_set_colorspace(dstinfo,srcinfo->jpeg_color_space);
  dstinfo->data_precision = srcinfo->data_precision;
  dstinfo->CCIR601_sampling = srcinfo->CCIR601_sampling;
  for (lVar12 = 0xc; lVar12 != 0x10; lVar12 = lVar12 + 1) {
    pJVar11 = srcinfo->quant_tbl_ptrs[lVar12 + -0xc];
    if (pJVar11 != (JQUANT_TBL *)0x0) {
      pJVar8 = dstinfo->quant_tbl_ptrs[lVar12 + -0xc];
      lVar9 = 0x20;
      if (pJVar8 == (JQUANT_TBL *)0x0) {
        pJVar8 = jpeg_alloc_quant_table((j_common_ptr)dstinfo);
        dstinfo->quant_tbl_ptrs[lVar12 + -0xc] = pJVar8;
        pJVar11 = srcinfo->quant_tbl_ptrs[lVar12 + -0xc];
      }
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined4 *)pJVar8->quantval = *(undefined4 *)pJVar11->quantval;
        pJVar11 = (JQUANT_TBL *)((long)pJVar11 + ((ulong)bVar14 * -2 + 1) * 4);
        pJVar8 = (JQUANT_TBL *)((long)pJVar8 + (ulong)bVar14 * -8 + 4);
      }
      dstinfo->quant_tbl_ptrs[lVar12 + -0xc]->sent_table = 0;
    }
  }
  iVar7 = srcinfo->num_components;
  dstinfo->num_components = iVar7;
  if (iVar7 - 0xbU < 0xfffffff6) {
    pjVar2 = dstinfo->err;
    pjVar2->msg_code = 0x1a;
    (pjVar2->msg_parm).i[0] = iVar7;
    (dstinfo->err->msg_parm).i[1] = 10;
    (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
  }
  pjVar13 = srcinfo->comp_info;
  pjVar10 = dstinfo->comp_info;
  for (iVar7 = 0; iVar7 < dstinfo->num_components; iVar7 = iVar7 + 1) {
    pjVar10->component_id = pjVar13->component_id;
    iVar5 = pjVar13->v_samp_factor;
    pjVar10->h_samp_factor = pjVar13->h_samp_factor;
    pjVar10->v_samp_factor = iVar5;
    uVar1 = pjVar13->quant_tbl_no;
    pjVar10->quant_tbl_no = uVar1;
    if ((3 < (ulong)uVar1) ||
       (pJVar11 = srcinfo->quant_tbl_ptrs[uVar1], pJVar11 == (JQUANT_TBL *)0x0)) {
      pjVar2 = dstinfo->err;
      pjVar2->msg_code = 0x34;
      (pjVar2->msg_parm).i[0] = uVar1;
      (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
      pJVar11 = srcinfo->quant_tbl_ptrs[(int)uVar1];
    }
    pJVar8 = pjVar13->quant_table;
    if (pJVar8 != (JQUANT_TBL *)0x0) {
      for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 1) {
        if (pJVar8->quantval[lVar12] != pJVar11->quantval[lVar12]) {
          pjVar2 = dstinfo->err;
          pjVar2->msg_code = 0x2c;
          (pjVar2->msg_parm).i[0] = uVar1;
          (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
        }
      }
    }
    pjVar13 = pjVar13 + 1;
    pjVar10 = pjVar10 + 1;
  }
  if (srcinfo->saw_JFIF_marker != 0) {
    if (srcinfo->JFIF_major_version == '\x01') {
      dstinfo->JFIF_major_version = '\x01';
      dstinfo->JFIF_minor_version = srcinfo->JFIF_minor_version;
    }
    dstinfo->density_unit = srcinfo->density_unit;
    UVar6 = srcinfo->Y_density;
    dstinfo->X_density = srcinfo->X_density;
    dstinfo->Y_density = UVar6;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_copy_critical_parameters(j_decompress_ptr srcinfo, j_compress_ptr dstinfo)
{
  JQUANT_TBL **qtblptr;
  jpeg_component_info *incomp, *outcomp;
  JQUANT_TBL *c_quant, *slot_quant;
  int tblno, ci, coefi;

  /* Safety check to ensure start_compress not called yet. */
  if (dstinfo->global_state != CSTATE_START)
    ERREXIT1(dstinfo, JERR_BAD_STATE, dstinfo->global_state);
  /* Copy fundamental image dimensions */
  dstinfo->image_width = srcinfo->image_width;
  dstinfo->image_height = srcinfo->image_height;
  dstinfo->input_components = srcinfo->num_components;
  dstinfo->in_color_space = srcinfo->jpeg_color_space;
#if JPEG_LIB_VERSION >= 70
  dstinfo->jpeg_width = srcinfo->output_width;
  dstinfo->jpeg_height = srcinfo->output_height;
  dstinfo->min_DCT_h_scaled_size = srcinfo->min_DCT_h_scaled_size;
  dstinfo->min_DCT_v_scaled_size = srcinfo->min_DCT_v_scaled_size;
#endif
  /* Initialize all parameters to default values */
  jpeg_set_defaults(dstinfo);
  /* jpeg_set_defaults may choose wrong colorspace, eg YCbCr if input is RGB.
   * Fix it to get the right header markers for the image colorspace.
   */
  jpeg_set_colorspace(dstinfo, srcinfo->jpeg_color_space);
  dstinfo->data_precision = srcinfo->data_precision;
  dstinfo->CCIR601_sampling = srcinfo->CCIR601_sampling;
  /* Copy the source's quantization tables. */
  for (tblno = 0; tblno < NUM_QUANT_TBLS; tblno++) {
    if (srcinfo->quant_tbl_ptrs[tblno] != NULL) {
      qtblptr = &dstinfo->quant_tbl_ptrs[tblno];
      if (*qtblptr == NULL)
        *qtblptr = jpeg_alloc_quant_table((j_common_ptr)dstinfo);
      MEMCOPY((*qtblptr)->quantval, srcinfo->quant_tbl_ptrs[tblno]->quantval,
              sizeof((*qtblptr)->quantval));
      (*qtblptr)->sent_table = FALSE;
    }
  }
  /* Copy the source's per-component info.
   * Note we assume jpeg_set_defaults has allocated the dest comp_info array.
   */
  dstinfo->num_components = srcinfo->num_components;
  if (dstinfo->num_components < 1 || dstinfo->num_components > MAX_COMPONENTS)
    ERREXIT2(dstinfo, JERR_COMPONENT_COUNT, dstinfo->num_components,
             MAX_COMPONENTS);
  for (ci = 0, incomp = srcinfo->comp_info, outcomp = dstinfo->comp_info;
       ci < dstinfo->num_components; ci++, incomp++, outcomp++) {
    outcomp->component_id = incomp->component_id;
    outcomp->h_samp_factor = incomp->h_samp_factor;
    outcomp->v_samp_factor = incomp->v_samp_factor;
    outcomp->quant_tbl_no = incomp->quant_tbl_no;
    /* Make sure saved quantization table for component matches the qtable
     * slot.  If not, the input file re-used this qtable slot.
     * IJG encoder currently cannot duplicate this.
     */
    tblno = outcomp->quant_tbl_no;
    if (tblno < 0 || tblno >= NUM_QUANT_TBLS ||
        srcinfo->quant_tbl_ptrs[tblno] == NULL)
      ERREXIT1(dstinfo, JERR_NO_QUANT_TABLE, tblno);
    slot_quant = srcinfo->quant_tbl_ptrs[tblno];
    c_quant = incomp->quant_table;
    if (c_quant != NULL) {
      for (coefi = 0; coefi < DCTSIZE2; coefi++) {
        if (c_quant->quantval[coefi] != slot_quant->quantval[coefi])
          ERREXIT1(dstinfo, JERR_MISMATCHED_QUANT_TABLE, tblno);
      }
    }
    /* Note: we do not copy the source's Huffman table assignments;
     * instead we rely on jpeg_set_colorspace to have made a suitable choice.
     */
  }
  /* Also copy JFIF version and resolution information, if available.
   * Strictly speaking this isn't "critical" info, but it's nearly
   * always appropriate to copy it if available.  In particular,
   * if the application chooses to copy JFIF 1.02 extension markers from
   * the source file, we need to copy the version to make sure we don't
   * emit a file that has 1.02 extensions but a claimed version of 1.01.
   * We will *not*, however, copy version info from mislabeled "2.01" files.
   */
  if (srcinfo->saw_JFIF_marker) {
    if (srcinfo->JFIF_major_version == 1) {
      dstinfo->JFIF_major_version = srcinfo->JFIF_major_version;
      dstinfo->JFIF_minor_version = srcinfo->JFIF_minor_version;
    }
    dstinfo->density_unit = srcinfo->density_unit;
    dstinfo->X_density = srcinfo->X_density;
    dstinfo->Y_density = srcinfo->Y_density;
  }
}